

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O3

_Bool borg_activate_item(wchar_t activation)

{
  long lVar1;
  char *what;
  ulong uVar2;
  long lVar3;
  
  if (borg.activation[activation] != 0) {
    uVar2 = (ulong)z_info->pack_size;
    lVar3 = uVar2 * -0x100000000;
    lVar1 = 0;
    do {
      if (((borg_items[uVar2].curses[lVar1 + -0x26] != false) &&
          (*(wchar_t *)(borg_items[uVar2].curses + lVar1 + -0x1e) == activation)) &&
         (*(short *)(borg_items[uVar2].curses + lVar1 + -0x18) == 0)) {
        what = format("# Activating item %s.",borg_items[uVar2].desc + lVar1);
        borg_note(what);
        borg_keypress(0x41);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           [(long)((ulong)z_info->pack_size * -0x100000000 - lVar3) >> 0x20]);
        return true;
      }
      lVar3 = lVar3 + -0x100000000;
      lVar1 = lVar1 + 0x388;
    } while (lVar1 != 0x2a60);
  }
  return false;
}

Assistant:

bool borg_activate_item(int activation)
{
    int i;

    /* a quick check of the array */
    if (!borg.activation[activation])
        return false;

    /* Check the equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        if (!item->iqty)
            continue;

        /* Skip wrong activation*/
        if (item->activ_idx != activation)
            continue;

        /* Check charge */
        if (item->timeout)
            continue;

        /* Log the message */
        borg_note(format("# Activating item %s.", item->desc));

        /* Perform the action */
        borg_keypress('A');
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        /* Success */
        return true;
    }

    /* Oops */
    return false;
}